

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sort.cpp
# Opt level: O2

void __thiscall MxxSort_StableSort_Test::TestBody(MxxSort_StableSort_Test *this)

{
  ulong uVar1;
  tuple<int,_int,_int> *ptVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  difference_type __d;
  pointer ptVar6;
  MPI_Datatype poVar7;
  unsigned_long uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  __normal_iterator<std::tuple<int,_int,_int>_*,_std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>_>
  _Var12;
  __normal_iterator<std::tuple<int,_int,_int>_*,_std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>_>
  _Var13;
  pointer ptVar14;
  undefined4 *puVar15;
  long lVar16;
  ulong uVar17;
  pointer puVar18;
  tuple<int,_int,_int> *ptVar19;
  pointer puVar20;
  ulong uVar21;
  comm *comm;
  pointer in_R9;
  uint uVar22;
  int iVar23;
  ulong uVar24;
  pointer ptVar25;
  pointer ptVar26;
  uint uVar27;
  size_type __new_size;
  size_type sVar28;
  bool bVar29;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  allocator_type local_141;
  tuple<int,_int,_int> *local_140;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  comm c;
  vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_> recv_elements;
  vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_> local_splitters;
  size_t local_size;
  uint local_b0;
  uint local_ac;
  long local_a8;
  pointer local_a0;
  pointer local_98;
  vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_> vec;
  datatype dt;
  
  mxx::comm::comm(&c);
  std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::vector
            (&vec,(long)c.m_rank + 100,(allocator_type *)&send_counts);
  if (c.m_rank == 0) {
    iVar23 = 0;
  }
  else {
    iVar23 = ((c.m_rank + 1) * c.m_rank) / 2 + c.m_rank * 100;
  }
  srand(c.m_rank * 7);
  lVar16 = 8;
  for (ptVar14 = (pointer)0x0;
      ptVar25 = vec.
                super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish,
      ptVar26 = vec.
                super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start, iVar3 = c.m_rank,
      ptVar6 = (pointer)(((long)vec.
                                super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)vec.
                               super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0xc), ptVar14 < ptVar6;
      ptVar14 = (pointer)((long)&(ptVar14->super__Tuple_impl<0UL,_int,_int,_int>).
                                 super__Tuple_impl<1UL,_int,_int>.super__Tuple_impl<2UL,_int>.
                                 super__Head_base<2UL,_int,_false>._M_head_impl + 1)) {
    iVar5 = rand();
    *(int *)((long)&((vec.
                      super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super__Tuple_impl<0UL,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int>.
                    super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl +
            lVar16) = iVar3;
    *(int *)((long)vec.
                   super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar16 + -4) = iVar23 + (int)ptVar14;
    *(int *)((long)vec.
                   super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar16 + -8) = iVar5 % 4;
    lVar16 = lVar16 + 0xc;
  }
  poVar7 = mxx::datatype_builder<std::tuple<int,_int,_int>_>::get_type();
  iVar23 = c.m_size;
  dt._vptr_datatype = (_func_int **)&PTR__datatype_001aad50;
  dt.builtin = false;
  uVar17 = (ulong)c.m_size;
  dt.mpitype = poVar7;
  std::
  stable_sort<__gnu_cxx::__normal_iterator<std::tuple<int,int,int>*,std::vector<std::tuple<int,int,int>,std::allocator<std::tuple<int,int,int>>>>,MxxSort_StableSort_Test::TestBody()::__0>
            (ptVar26,ptVar25);
  if (iVar23 != 1) {
    local_size = (size_t)ptVar6;
    uVar8 = mxx::allreduce<unsigned_long,std::plus<unsigned_long>>(&local_size,&c);
    comm = (comm *)local_size;
    bVar4 = mxx::all_of(local_size ==
                        uVar8 / uVar17 + (ulong)((ulong)(long)c.m_rank < uVar8 % uVar17),&c);
    local_140 = ptVar26;
    iVar23 = iVar23 + -1;
    local_splitters.
    super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_splitters.
    super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_splitters.
    super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    sVar28 = (size_type)iVar23;
    if (bVar4) {
      if (ptVar25 == ptVar26) {
        mxx::assert_fail("local_size > 0",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/samplesort.hpp"
                         ,0xa9,"sample_block_decomp");
      }
      iVar3 = c.m_size;
      lVar16 = (long)c.m_size;
      std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::vector
                ((vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_> *)
                 &recv_counts,sVar28,(allocator_type *)&send_counts);
      puVar18 = recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start + 1;
      ptVar19 = local_140;
      for (uVar21 = 0;
          ((long)recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start) / 0xc != uVar21; uVar21 = uVar21 + 1) {
        lVar9 = (ulong)ptVar6 / uVar17 + (ulong)(uVar21 < (ulong)ptVar6 % uVar17);
        *(int *)puVar18 =
             ptVar19[lVar9 + -1].super__Tuple_impl<0UL,_int,_int,_int>.
             super__Head_base<0UL,_int,_false>._M_head_impl;
        *(int *)((long)puVar18 + -4) =
             ptVar19[lVar9 + -1].super__Tuple_impl<0UL,_int,_int,_int>.
             super__Tuple_impl<1UL,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl;
        ptVar2 = ptVar19 + lVar9 + -1;
        ptVar19 = ptVar19 + lVar9;
        *(int *)(puVar18 + -1) =
             (ptVar2->super__Tuple_impl<0UL,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int>.
             super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl;
        puVar18 = (pointer)((long)puVar18 + 0xc);
      }
      if (c.m_rank == 0) {
        std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::vector
                  ((vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_> *
                   )&send_counts,(long)(iVar3 * iVar23),(allocator_type *)&recv_elements);
        MPI_Gather(recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start,iVar23,poVar7,
                   send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start,iVar23,poVar7,0,c.mpi_comm);
        ptVar19 = local_140;
        std::
        sort<__gnu_cxx::__normal_iterator<std::tuple<int,int,int>*,std::vector<std::tuple<int,int,int>,std::allocator<std::tuple<int,int,int>>>>,MxxSort_StableSort_Test::TestBody()::__0>
                  (send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
        lVar9 = lVar16 + -1;
        if (((long)recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
            (long)recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start) / 0xc != lVar9) {
          std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::
          resize((vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_> *)
                 &recv_counts,lVar16 - 1);
          lVar9 = ((long)recv_counts.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)recv_counts.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0xc;
        }
        puVar15 = (undefined4 *)
                  ((long)send_counts.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start + sVar28 * 0xc + -4);
        puVar18 = recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start + 1;
        while (bVar29 = lVar9 != 0, lVar9 = lVar9 + -1, bVar29) {
          *(undefined4 *)puVar18 = *puVar15;
          *(undefined4 *)((long)puVar18 + -4) = puVar15[-1];
          *(undefined4 *)(puVar18 + -1) = puVar15[-2];
          puVar15 = puVar15 + sVar28 * 3;
          puVar18 = (pointer)((long)puVar18 + 0xc);
        }
        std::_Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::
        ~_Vector_base((_Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                       *)&send_counts);
      }
      else {
        MPI_Gather(recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start,iVar23,poVar7,0,0,poVar7,0,c.mpi_comm);
        ptVar19 = local_140;
        if (((long)recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
            (long)recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start) / 0xc != lVar16 + -1) {
          std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::
          resize((vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_> *)
                 &recv_counts,(long)(iVar3 + -1));
        }
      }
      MPI_Bcast(recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start,
                ((long)recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start) / 0xc & 0xffffffff,poVar7,0,
                c.mpi_comm);
      std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::
      _M_move_assign(&local_splitters,
                     (_Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                      *)&recv_counts);
      std::_Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::
      ~_Vector_base((_Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                     *)&recv_counts);
    }
    else {
      recv_elements.
      super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start = ptVar6;
      uVar8 = mxx::allreduce<unsigned_long,std::plus<unsigned_long>>(&recv_elements,&c);
      iVar23 = c.m_size;
      lVar16 = (long)c.m_size;
      if (recv_elements.
          super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
        recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
      else {
        uVar17 = (uVar8 + (long)recv_elements.
                                super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start * lVar16 * sVar28) - 1;
        __new_size = 1;
        if (uVar8 <= uVar17) {
          __new_size = uVar17 / uVar8;
        }
        recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::resize
                  ((vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_> *
                   )&recv_counts,__new_size);
        puVar18 = recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start + 1;
        ptVar19 = local_140;
        for (comm = (comm *)0x0;
            (comm *)(((long)recv_counts.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)recv_counts.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start) / 0xc) != comm;
            comm = (comm *)((long)&comm->_vptr_comm + 1)) {
          lVar9 = (ulong)recv_elements.
                         super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start / (__new_size + 1) +
                  (ulong)(comm < (comm *)((ulong)recv_elements.
                                                 super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start %
                                         (__new_size + 1)));
          *(int *)puVar18 =
               ptVar19[lVar9 + -1].super__Tuple_impl<0UL,_int,_int,_int>.
               super__Head_base<0UL,_int,_false>._M_head_impl;
          *(int *)((long)puVar18 + -4) =
               ptVar19[lVar9 + -1].super__Tuple_impl<0UL,_int,_int,_int>.
               super__Tuple_impl<1UL,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl;
          ptVar2 = ptVar19 + lVar9 + -1;
          ptVar19 = ptVar19 + lVar9;
          *(int *)(puVar18 + -1) =
               (ptVar2->super__Tuple_impl<0UL,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int>.
               super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl;
          puVar18 = (pointer)((long)puVar18 + 0xc);
        }
      }
      mxx::gatherv<std::tuple<int,int,int>>
                ((vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_> *)
                 &send_counts,(mxx *)&recv_counts,
                 (vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_> *)
                 0x0,(int)&c,comm);
      if (c.m_rank == 0) {
        std::
        sort<__gnu_cxx::__normal_iterator<std::tuple<int,int,int>*,std::vector<std::tuple<int,int,int>,std::allocator<std::tuple<int,int,int>>>>,MxxSort_StableSort_Test::TestBody()::__0>
                  (send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
        uVar17 = lVar16 - 1;
        if (((long)recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
            (long)recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start) / 0xc != uVar17) {
          std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::
          resize((vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_> *)
                 &recv_counts,(long)(iVar23 + -1));
          uVar17 = ((long)recv_counts.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)recv_counts.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start) / 0xc;
        }
        puVar15 = (undefined4 *)
                  ((long)send_counts.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start + sVar28 * 0xc + -4);
        puVar18 = recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start + 1;
        uVar21 = uVar17;
        while (bVar29 = uVar21 != 0, uVar21 = uVar21 - 1, bVar29) {
          *(undefined4 *)puVar18 = *puVar15;
          *(undefined4 *)((long)puVar18 + -4) = puVar15[-1];
          *(undefined4 *)(puVar18 + -1) = puVar15[-2];
          puVar15 = puVar15 + sVar28 * 3;
          puVar18 = (pointer)((long)puVar18 + 0xc);
        }
      }
      else {
        uVar17 = ((long)recv_counts.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0xc;
      }
      uVar21 = lVar16 - 1;
      if (uVar17 != uVar21) {
        std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::resize
                  ((vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_> *
                   )&recv_counts,(long)(iVar23 + -1));
        uVar21 = ((long)recv_counts.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0xc;
      }
      MPI_Bcast(recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start,uVar21 & 0xffffffff,poVar7,0,c.mpi_comm);
      std::_Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::
      ~_Vector_base((_Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                     *)&send_counts);
      std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::
      _M_move_assign(&local_splitters,
                     (_Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                      *)&recv_counts);
      std::_Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::
      ~_Vector_base((_Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                     *)&recv_counts);
      ptVar19 = local_140;
    }
    send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    sVar28 = (size_type)c.m_size;
    if (((long)local_splitters.
               super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_splitters.
              super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start) / 0xc != sVar28 - 1) {
      mxx::assert_fail("splitters.size() == (size_t) comm.size() - 1",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/samplesort.hpp"
                       ,0x11d,"stable_split");
      sVar28 = (size_type)c.m_size;
    }
    recv_elements.
    super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&recv_counts,sVar28,(value_type_conflict2 *)&recv_elements,&local_141);
    in_R9 = local_splitters.
            super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    puVar18 = recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar21 = ((long)local_splitters.
                    super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_splitters.
                   super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0xc;
    local_a8 = (long)c.m_size;
    local_a0 = recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
               .super__Vector_impl_data._M_start;
    local_b0 = c.m_rank;
    uVar17 = 0;
    _Var13._M_current = ptVar19;
    uVar22 = c.m_rank;
    while (uVar17 < uVar21) {
      local_98 = in_R9 + uVar17;
      iVar23 = in_R9[uVar17].super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
               super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl;
      uVar24 = 0;
      local_ac = uVar22;
      while( true ) {
        uVar27 = (int)uVar24 + 1;
        uVar1 = uVar17 + uVar27;
        if ((uVar21 <= uVar1) ||
           (iVar23 < in_R9[uVar1].super__Tuple_impl<0UL,_int,_int,_int>.
                     super__Tuple_impl<1UL,_int,_int>.super__Tuple_impl<2UL,_int>.
                     super__Head_base<2UL,_int,_false>._M_head_impl)) break;
        local_ac = local_ac + uVar22;
        uVar24 = (ulong)uVar27;
      }
      uVar11 = ((long)ptVar25 - (long)ptVar19) / 0xc;
      _Var13._M_current = ptVar19;
      do {
        while( true ) {
          uVar10 = uVar11;
          _Var12._M_current = _Var13._M_current;
          if ((long)uVar10 < 1) goto LAB_00162d1a;
          uVar11 = uVar10 >> 1;
          ptVar2 = _Var13._M_current + uVar11;
          iVar3 = _Var13._M_current[uVar11].super__Tuple_impl<0UL,_int,_int,_int>.
                  super__Tuple_impl<1UL,_int,_int>.super__Tuple_impl<2UL,_int>.
                  super__Head_base<2UL,_int,_false>._M_head_impl;
          if (iVar23 <= iVar3) break;
          _Var13._M_current = ptVar2 + 1;
          uVar11 = ~uVar11 + uVar10;
        }
      } while (iVar23 < iVar3);
      _Var12 = std::
               __lower_bound<__gnu_cxx::__normal_iterator<std::tuple<int,int,int>*,std::vector<std::tuple<int,int,int>,std::allocator<std::tuple<int,int,int>>>>,std::tuple<int,int,int>,__gnu_cxx::__ops::_Iter_comp_val<MxxSort_StableSort_Test::TestBody()::__0>>
                         (_Var13._M_current,ptVar2,local_98);
      _Var13 = std::
               __upper_bound<__gnu_cxx::__normal_iterator<std::tuple<int,int,int>*,std::vector<std::tuple<int,int,int>,std::allocator<std::tuple<int,int,int>>>>,std::tuple<int,int,int>,__gnu_cxx::__ops::_Val_comp_iter<MxxSort_StableSort_Test::TestBody()::__0>>
                         (ptVar2 + 1,_Var13._M_current + uVar10,local_98);
      uVar22 = local_b0;
LAB_00162d1a:
      local_a0[uVar17] = local_a0[uVar17] + ((long)_Var12._M_current - (long)ptVar19) / 0xc;
      puVar20 = puVar18 + uVar17 + 1;
      if ((int)uVar24 != 0) {
        if (local_ac / (uint)local_a8 < uVar27) {
          uVar24 = (ulong)(local_ac / (uint)local_a8);
        }
        puVar20 = puVar20 + uVar24;
      }
      *puVar20 = *puVar20 + ((long)_Var13._M_current - (long)_Var12._M_current) / 0xc;
      uVar17 = uVar1;
      ptVar19 = _Var13._M_current;
      _Var13._M_current = local_140;
    }
    local_a0[local_a8 + -1] = local_a0[local_a8 + -1] + ((long)ptVar25 - (long)ptVar19) / 0xc;
    ptVar14 = (pointer)0x0;
    for (puVar18 = local_a0;
        puVar18 !=
        recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish; puVar18 = puVar18 + 1) {
      ptVar14 = (pointer)((long)&(ptVar14->super__Tuple_impl<0UL,_int,_int,_int>).
                                 super__Tuple_impl<1UL,_int,_int>.super__Tuple_impl<2UL,_int>.
                                 super__Head_base<2UL,_int,_false>._M_head_impl + *puVar18);
    }
    if (ptVar14 != ptVar6) {
      mxx::assert_fail("std::accumulate(send_counts.begin(), send_counts.end(), 0ull) == local_size"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/samplesort.hpp"
                       ,0x146,"stable_split");
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
              (&send_counts,
               &recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    mxx::all2all<unsigned_long>(&recv_counts,&send_counts,&c);
    uVar17 = 0;
    for (puVar18 = recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        puVar18 !=
        recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish; puVar18 = puVar18 + 1) {
      uVar17 = uVar17 + *puVar18;
    }
    if ((2 < local_size && bVar4) && (local_size * 2 < uVar17)) {
      mxx::assert_fail("!_AssumeBlockDecomp || (local_size <= 2 || recv_n <= 2* local_size)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/samplesort.hpp"
                       ,0x193,"samplesort");
    }
    std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::vector
              (&recv_elements,uVar17,(allocator_type *)&local_141);
    mxx::all2allv<std::tuple<int,int,int>>
              (_Var13._M_current,&send_counts,
               recv_elements.
               super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start,&recv_counts,&c);
    std::
    stable_sort<__gnu_cxx::__normal_iterator<std::tuple<int,int,int>*,std::vector<std::tuple<int,int,int>,std::allocator<std::tuple<int,int,int>>>>,MxxSort_StableSort_Test::TestBody()::__0>
              (recv_elements.
               super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               recv_elements.
               super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    if (bVar4) {
      mxx::
      stable_distribute<__gnu_cxx::__normal_iterator<std::tuple<int,int,int>*,std::vector<std::tuple<int,int,int>,std::allocator<std::tuple<int,int,int>>>>,__gnu_cxx::__normal_iterator<std::tuple<int,int,int>*,std::vector<std::tuple<int,int,int>,std::allocator<std::tuple<int,int,int>>>>>
                ((__normal_iterator<std::tuple<int,_int,_int>_*,_std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>_>
                  )recv_elements.
                   super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<std::tuple<int,_int,_int>_*,_std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>_>
                  )recv_elements.
                   super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,_Var13,&c);
    }
    else {
      mxx::
      redo_arbit_decomposition<__gnu_cxx::__normal_iterator<std::tuple<int,int,int>*,std::vector<std::tuple<int,int,int>,std::allocator<std::tuple<int,int,int>>>>,__gnu_cxx::__normal_iterator<std::tuple<int,int,int>*,std::vector<std::tuple<int,int,int>,std::allocator<std::tuple<int,int,int>>>>>
                ((__normal_iterator<std::tuple<int,_int,_int>_*,_std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>_>
                  )recv_elements.
                   super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<std::tuple<int,_int,_int>_*,_std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>_>
                  )recv_elements.
                   super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,_Var13,local_size,&c);
    }
    std::_Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::
    ~_Vector_base(&recv_elements.
                   super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                 );
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::
    ~_Vector_base(&local_splitters.
                   super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                 );
  }
  mxx::datatype::~datatype(&dt);
  ptVar14 = vec.
            super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ptVar26 = vec.
            super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ptVar25 = vec.
            super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (vec.super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      vec.super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    while (ptVar6 = ptVar25, ptVar25 = ptVar6 + 1,
          ptVar26 = vec.
                    super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
          ptVar25 !=
          vec.
          super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
      ptVar14 = ptVar14 + 1;
      iVar23 = (ptVar6->super__Tuple_impl<0UL,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int>.
               super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl;
      iVar3 = (ptVar25->super__Tuple_impl<0UL,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int>.
              super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl;
      ptVar26 = ptVar25;
      if ((iVar3 < iVar23) ||
         ((iVar3 == iVar23 &&
          (ptVar26 = ptVar14,
          ptVar6[1].super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
          super__Head_base<1UL,_int,_false>._M_head_impl <
          (ptVar6->super__Tuple_impl<0UL,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int>.
          super__Head_base<1UL,_int,_false>._M_head_impl)))) break;
    }
  }
  if (c.m_size == 1) {
    local_splitters.
    super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_splitters.
    super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(local_splitters.
                           super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,
                           ptVar26 ==
                           vec.
                           super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
    if (ptVar26 ==
        vec.
        super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_finish) goto LAB_001630aa;
  }
  else {
    mxx::comm::comm((comm *)&send_counts);
    mxx::right_shift<std::tuple<int,int,int>>
              ((mxx *)&recv_counts,
               vec.
               super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1,(comm *)&send_counts);
    mxx::comm::~comm((comm *)&send_counts);
    bVar4 = c.m_rank < 1 &&
            ptVar26 ==
            vec.
            super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
    if ((0 < c.m_rank) &&
       (ptVar26 ==
        vec.
        super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_finish)) {
      iVar23 = ((vec.
                 super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->super__Tuple_impl<0UL,_int,_int,_int>).
               super__Tuple_impl<1UL,_int,_int>.super__Tuple_impl<2UL,_int>.
               super__Head_base<2UL,_int,_false>._M_head_impl;
      if (iVar23 < (int)recv_counts.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start) {
        bVar4 = false;
      }
      else {
        bVar4 = true;
        if (iVar23 == (int)recv_counts.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start) {
          bVar4 = recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start._4_4_ <=
                  ((vec.
                    super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super__Tuple_impl<0UL,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int>.
                  super__Head_base<1UL,_int,_false>._M_head_impl;
        }
      }
    }
    bVar4 = mxx::all_of(bVar4,&c);
    local_splitters.
    super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(local_splitters.
                           super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,bVar4);
    local_splitters.
    super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (bVar4) goto LAB_001630aa;
  }
  local_splitters.
  super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  testing::Message::Message((Message *)&recv_counts);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)&send_counts,(internal *)&local_splitters,
             (AssertionResult *)"mxx::is_sorted(vec.begin(), vec.end(), full_cmp, c)","false","true"
             ,(char *)in_R9);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&recv_elements,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_sort.cpp"
             ,0x74,(char *)send_counts.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start);
  testing::internal::AssertHelper::operator=((AssertHelper *)&recv_elements,(Message *)&recv_counts)
  ;
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&recv_elements);
  std::__cxx11::string::~string((string *)&send_counts);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&recv_counts);
LAB_001630aa:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_splitters.
                  super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
  std::_Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::
  ~_Vector_base(&vec.
                 super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
               );
  mxx::comm::~comm(&c);
  return;
}

Assistant:

TEST(MxxSort, StableSort) {
    mxx::comm c;
    typedef std::tuple<int,int,int> tuple_t;
    std::vector<tuple_t> vec(100+c.rank());
    size_t prefix = c.rank() == 0 ? 0 : (100*(c.rank()) + ((c.rank()+1)*c.rank())/2);
    std::srand(c.rank()*7);
    for (size_t i = 0; i < vec.size(); ++i) {
        vec[i] = tuple_t(c.rank(), prefix+i, std::rand() % 4);
    }

    auto snd_cmp = [](const tuple_t& x, const tuple_t& y) {
        return std::get<2>(x) < std::get<2>(y);
    };
    // stably sort only by second index
    mxx::stable_sort(vec.begin(), vec.end(), snd_cmp, c);

    //c.exlusively_in_order_do([&]() {
    //    std::cout << "[Rank " << c.rank() << "]: " << vec << std::endl;
    //});

    // assert it is sorted lexicographically by both (second, first)
    auto full_cmp = [](const tuple_t& x, const tuple_t& y) {
        return std::get<2>(x) < std::get<2>(y) || (std::get<2>(x) == std::get<2>(y) && std::get<1>(x) < std::get<1>(y));
    };
    ASSERT_TRUE(mxx::is_sorted(vec.begin(), vec.end(), full_cmp, c));
}